

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

TrackPosition * __thiscall mkvparser::CuePoint::Find(CuePoint *this,Track *pTrack)

{
  TrackPosition *pTVar1;
  long lVar2;
  TrackPosition *p;
  TrackPosition *j;
  TrackPosition *i;
  longlong n;
  Track *pTrack_local;
  CuePoint *this_local;
  
  if (pTrack == (Track *)0x0) {
    this_local = (CuePoint *)0x0;
  }
  else {
    lVar2 = Track::GetNumber(pTrack);
    pTVar1 = this->m_track_positions;
    do {
      j = pTVar1;
      if (j == this->m_track_positions + this->m_track_positions_count) {
        return (TrackPosition *)0x0;
      }
      pTVar1 = j + 1;
    } while (j->m_track != lVar2);
    this_local = (CuePoint *)j;
  }
  return (TrackPosition *)this_local;
}

Assistant:

const CuePoint::TrackPosition* CuePoint::Find(const Track* pTrack) const {
  if (pTrack == NULL) {
    return NULL;
  }

  const long long n = pTrack->GetNumber();

  const TrackPosition* i = m_track_positions;
  const TrackPosition* const j = i + m_track_positions_count;

  while (i != j) {
    const TrackPosition& p = *i++;

    if (p.m_track == n)
      return &p;
  }

  return NULL;  // no matching track number found
}